

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O2

void __thiscall
db_unpacker::extract_2215(db_unpacker *this,string *prefix,string *mask,xr_reader *s,uint8_t *data)

{
  uint32_t size_real;
  uint32_t size_compressed;
  uint *puVar1;
  bool bVar2;
  xr_file_system *this_00;
  long lVar3;
  ulong uVar4;
  string path;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = xray_re::xr_file_system::instance();
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  do {
    while( true ) {
      bVar2 = xray_re::xr_reader::eof(s);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_70);
        return;
      }
      xray_re::xr_reader::r_sz(s,&local_70);
      puVar1 = (s->field_2).m_p_u32;
      (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
      uVar4 = (ulong)*puVar1;
      (s->field_2).m_p = (uint8_t *)(puVar1 + 2);
      size_real = puVar1[1];
      (s->field_2).m_p = (uint8_t *)(puVar1 + 3);
      size_compressed = puVar1[2];
      if ((uVar4 == 0) || (mask->_M_string_length == 0)) break;
      lVar3 = std::__cxx11::string::find((string *)&local_70,(ulong)mask);
      if (lVar3 != -1) {
LAB_0011effd:
        std::operator+(&local_50,prefix,&local_70);
        write_file(this_00,&local_50,data + uVar4,size_real,size_compressed);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if (uVar4 != 0) goto LAB_0011effd;
    std::operator+(&local_50,prefix,&local_70);
    xray_re::xr_file_system::create_folder(this_00,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

void db_unpacker::extract_2215(const std::string& prefix, const std::string& mask, xr_reader* s, const uint8_t* data) const
{
	xr_file_system& fs = xr_file_system::instance();
	for (std::string path; !s->eof(); ) {
		s->r_sz(path);
		unsigned offset = s->r_u32();
		unsigned size_real = s->r_u32();
		unsigned size_compressed = s->r_u32();

		if (mask.length() && (offset != 0))
		//if (path.compare(path.size()-mask.size(),mask.size(),mask) != 0)
		if (path.find(mask) == -1)
		continue;

		if (DB_DEBUG && fs.read_only()) {
			msg("%s", path.c_str());
			msg("  offset: %u", offset);
			msg("  size (real): %u", size_real);
			msg("  size (compressed): %u", size_compressed);
		} else if (offset == 0) {
			fs.create_folder(prefix + path);
		} else {
			write_file(fs, prefix + path, data + offset, size_real, size_compressed);
		}
	}
}